

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall
draco::ObjEncoder::EncodeToBuffer(ObjEncoder *this,Mesh *mesh,EncoderBuffer *out_buffer)

{
  bool bVar1;
  
  this->in_mesh_ = mesh;
  bVar1 = EncodeToBuffer(this,&mesh->super_PointCloud,out_buffer);
  return bVar1;
}

Assistant:

bool ObjEncoder::EncodeToBuffer(const Mesh &mesh, EncoderBuffer *out_buffer) {
  in_mesh_ = &mesh;
  return EncodeToBuffer(static_cast<const PointCloud &>(mesh), out_buffer);
}